

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib540.c
# Opt level: O0

int loop(int num,CURLM *cm,char *url,char *userpwd,curl_slist *headers)

{
  CURL *pCVar1;
  undefined8 uVar2;
  CURLMcode CVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  timeval tVar9;
  timeval older;
  timeval older_00;
  int local_28c;
  CURL *e;
  int i;
  int ec_3;
  int itimeout;
  CURLMcode ec_2;
  CURLMcode ec_1;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  int local_1e0;
  CURLMcode ec;
  int M;
  int res;
  timeval T;
  fd_set E;
  fd_set W;
  fd_set R;
  int U;
  int Q;
  long L;
  CURLMsg *msg;
  curl_slist *headers_local;
  char *userpwd_local;
  char *url_local;
  CURLM *cm_local;
  int num_local;
  
  R.__fds_bits[0xf]._0_4_ = -1;
  ec = CURLM_OK;
  msg = (CURLMsg *)headers;
  headers_local = (curl_slist *)userpwd;
  userpwd_local = url;
  url_local = (char *)cm;
  cm_local._0_4_ = num;
  ec = init((EVP_PKEY_CTX *)(ulong)(uint)num);
  cm_local._4_4_ = ec;
  if (ec == CURLM_OK) {
    do {
      if ((int)R.__fds_bits[0xf] == 0) {
        return 0;
      }
      local_1e0 = -99;
      CVar3 = curl_multi_perform(url_local,R.__fds_bits + 0xf);
      uVar2 = _stderr;
      if (CVar3 == CURLM_OK) {
        if ((int)R.__fds_bits[0xf] < 0) {
          curl_mfprintf(_stderr,
                        "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                        ,0x76,(int)R.__fds_bits[0xf]);
          ec = 0x7a;
        }
      }
      else {
        uVar5 = curl_multi_strerror(CVar3);
        curl_mfprintf(uVar2,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                      ,0x76,CVar3,uVar5);
        ec = CVar3;
      }
      if (ec != CURLM_OK) {
        return ec;
      }
      tVar9 = tutil_tvnow();
      older.tv_usec = tv_test_start.tv_usec;
      older.tv_sec = tv_test_start.tv_sec;
      lVar6 = tutil_tvdiff(tVar9,older);
      if (60000 < lVar6) {
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                      ,0x7a);
        ec = 0x7d;
      }
      if (ec != CURLM_OK) {
        return ec;
      }
      if ((int)R.__fds_bits[0xf] != 0) {
        for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
          W.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
        }
        for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
          E.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
        }
        for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
          E.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
        }
        CVar3 = curl_multi_fdset(url_local,W.__fds_bits + 0xf,E.__fds_bits + 0xf,&T.tv_usec,
                                 &local_1e0);
        uVar2 = _stderr;
        if (CVar3 == CURLM_OK) {
          if (local_1e0 < -1) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                          ,0x83,local_1e0);
            ec = 0x7a;
          }
        }
        else {
          uVar5 = curl_multi_strerror(CVar3);
          curl_mfprintf(uVar2,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                        ,0x83,CVar3,uVar5);
          ec = CVar3;
        }
        if (ec != CURLM_OK) {
          return ec;
        }
        CVar3 = curl_multi_timeout(url_local,&U);
        uVar2 = _stderr;
        if (CVar3 == CURLM_OK) {
          if (_U < -1) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                          ,0x89,_U);
            ec = 0x73;
          }
        }
        else {
          uVar5 = curl_multi_strerror(CVar3);
          curl_mfprintf(uVar2,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                        ,0x89,CVar3,uVar5);
          ec = CVar3;
        }
        if (ec != CURLM_OK) {
          return ec;
        }
        if (_U == -1) {
          _M = 5;
          T.tv_sec = 0;
        }
        else {
          if (_U < 0x80000000) {
            local_28c = (int)_U;
          }
          else {
            local_28c = 0x7fffffff;
          }
          _M = (long)(local_28c / 1000);
          T.tv_sec = (__time_t)((local_28c % 1000) * 1000);
        }
        iVar4 = select_wrapper(local_1e0 + 1,(fd_set *)(W.__fds_bits + 0xf),
                               (fd_set *)(E.__fds_bits + 0xf),(fd_set *)&T.tv_usec,(timeval *)&M);
        if (iVar4 == -1) {
          piVar7 = __errno_location();
          uVar2 = _stderr;
          iVar4 = *piVar7;
          pcVar8 = strerror(iVar4);
          curl_mfprintf(uVar2,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                        ,0x99,iVar4,pcVar8);
          ec = 0x79;
        }
        if (ec != CURLM_OK) {
          return ec;
        }
      }
LAB_00102b69:
      L = curl_multi_info_read(url_local,(undefined1 *)((long)R.__fds_bits + 0x7c));
      uVar2 = _stderr;
      if ((int *)L != (int *)0x0) {
        if (*(int *)L == 1) {
          pCVar1 = *(CURL **)(L + 8);
          iVar4 = *(int *)(L + 0x10);
          uVar5 = curl_easy_strerror(*(int *)(L + 0x10));
          curl_mfprintf(uVar2,"R: %d - %s\n",iVar4,uVar5);
          curl_multi_remove_handle(url_local,pCVar1);
          curl_easy_cleanup(pCVar1);
          for (e._4_4_ = 0; e._4_4_ < 2; e._4_4_ = e._4_4_ + 1) {
            if (eh[e._4_4_] == pCVar1) {
              eh[e._4_4_] = (CURL *)0x0;
              break;
            }
          }
        }
        else {
          curl_mfprintf(_stderr,"E: CURLMsg (%d)\n",*(int *)L);
        }
        goto LAB_00102b69;
      }
      tVar9 = tutil_tvnow();
      older_00.tv_usec = tv_test_start.tv_usec;
      older_00.tv_sec = tv_test_start.tv_sec;
      lVar6 = tutil_tvdiff(tVar9,older_00);
      if (60000 < lVar6) {
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib540.c"
                      ,0xb1);
        ec = 0x7d;
      }
    } while (ec == CURLM_OK);
    cm_local._4_4_ = ec;
  }
  return cm_local._4_4_;
}

Assistant:

static int loop(int num, CURLM *cm, const char *url, const char *userpwd,
                struct curl_slist *headers)
{
  CURLMsg *msg;
  long L;
  int Q, U = -1;
  fd_set R, W, E;
  struct timeval T;
  int res = 0;

  res = init(num, cm, url, userpwd, headers);
  if(res)
    return res;

  while(U) {

    int M = -99;

    res_multi_perform(cm, &U);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(U) {
      FD_ZERO(&R);
      FD_ZERO(&W);
      FD_ZERO(&E);

      res_multi_fdset(cm, &R, &W, &E, &M);
      if(res)
        return res;

      /* At this point, M is guaranteed to be greater or equal than -1. */

      res_multi_timeout(cm, &L);
      if(res)
        return res;

      /* At this point, L is guaranteed to be greater or equal than -1. */

      if(L != -1) {
        int itimeout = (L > (long)INT_MAX) ? INT_MAX : (int)L;
        T.tv_sec = itimeout/1000;
        T.tv_usec = (itimeout%1000)*1000;
      }
      else {
        T.tv_sec = 5;
        T.tv_usec = 0;
      }

      res_select_test(M + 1, &R, &W, &E, &T);
      if(res)
        return res;
    }

    while((msg = curl_multi_info_read(cm, &Q)) != NULL) {
      if(msg->msg == CURLMSG_DONE) {
        int i;
        CURL *e = msg->easy_handle;
        fprintf(stderr, "R: %d - %s\n", (int)msg->data.result,
                curl_easy_strerror(msg->data.result));
        curl_multi_remove_handle(cm, e);
        curl_easy_cleanup(e);
        for(i = 0; i < NUM_HANDLES; i++) {
          if(eh[i] == e) {
            eh[i] = NULL;
            break;
          }
        }
      }
      else
        fprintf(stderr, "E: CURLMsg (%d)\n", (int)msg->msg);
    }

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}